

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O1

boolean get_interesting_appn(j_decompress_ptr cinfo)

{
  byte bVar1;
  int iVar2;
  jpeg_source_mgr *pjVar3;
  jpeg_error_mgr *pjVar4;
  boolean bVar5;
  uint datalen;
  ulong uVar6;
  long remaining;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  byte *pbVar11;
  JOCTET b [14];
  byte local_3e [14];
  
  pjVar3 = cinfo->src;
  sVar10 = pjVar3->bytes_in_buffer;
  if (sVar10 == 0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 != 0) {
      sVar10 = pjVar3->bytes_in_buffer;
      goto LAB_0027c2ab;
    }
LAB_0027c379:
    bVar5 = 0;
  }
  else {
LAB_0027c2ab:
    bVar1 = *pjVar3->next_input_byte;
    sVar10 = sVar10 - 1;
    if (sVar10 == 0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) goto LAB_0027c379;
      pbVar11 = pjVar3->next_input_byte;
      sVar10 = pjVar3->bytes_in_buffer;
    }
    else {
      pbVar11 = pjVar3->next_input_byte + 1;
    }
    uVar8 = (ulong)bVar1 * 0x100;
    uVar7 = uVar8 | *pbVar11;
    uVar8 = (uVar8 + *pbVar11) - 2;
    uVar9 = uVar8 & 0xffffffff;
    if (uVar7 < 3) {
      uVar9 = 0;
    }
    uVar6 = 0xe;
    if (uVar7 < 0x10) {
      uVar6 = uVar9;
    }
    pbVar11 = pbVar11 + 1;
    sVar10 = sVar10 - 1;
    datalen = (uint)uVar6;
    if (datalen != 0) {
      uVar7 = 0;
      do {
        if (sVar10 == 0) {
          bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
          if (bVar5 == 0) goto LAB_0027c379;
          pbVar11 = pjVar3->next_input_byte;
          sVar10 = pjVar3->bytes_in_buffer;
        }
        local_3e[uVar7] = *pbVar11;
        uVar7 = uVar7 + 1;
        pbVar11 = pbVar11 + 1;
        sVar10 = sVar10 - 1;
      } while (uVar6 != uVar7);
    }
    remaining = uVar8 - uVar6;
    iVar2 = cinfo->unread_marker;
    if (iVar2 == 0xee) {
      examine_app14(cinfo,local_3e,datalen,remaining);
    }
    else if (iVar2 == 0xe0) {
      examine_app0(cinfo,local_3e,datalen,remaining);
    }
    else {
      pjVar4 = cinfo->err;
      pjVar4->msg_code = 0x46;
      (pjVar4->msg_parm).i[0] = iVar2;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pjVar3->next_input_byte = pbVar11;
    pjVar3->bytes_in_buffer = sVar10;
    bVar5 = 1;
    if (0 < remaining) {
      (*cinfo->src->skip_input_data)(cinfo,remaining);
    }
  }
  return bVar5;
}

Assistant:

METHODDEF(boolean)
get_interesting_appn (j_decompress_ptr cinfo)
/* Process an APP0 or APP14 marker without saving it */
{
  INT32 length;
  JOCTET b[APPN_DATA_LEN];
  unsigned int i, numtoread;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  /* get the interesting part of the marker data */
  if (length >= APPN_DATA_LEN)
    numtoread = APPN_DATA_LEN;
  else if (length > 0)
    numtoread = (unsigned int) length;
  else
    numtoread = 0;
  for (i = 0; i < numtoread; i++)
    INPUT_BYTE(cinfo, b[i], return FALSE);
  length -= numtoread;

  /* process it */
  switch (cinfo->unread_marker) {
  case M_APP0:
    examine_app0(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  case M_APP14:
    examine_app14(cinfo, (JOCTET FAR *) b, numtoread, length);
    break;
  default:
    /* can't get here unless jpeg_save_markers chooses wrong processor */
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
    break;
  }

  /* skip any remaining data -- could be lots */
  INPUT_SYNC(cinfo);
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long) length);

  return TRUE;
}